

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_mpi.c
# Opt level: O0

REF_STATUS ref_mpi_create(REF_MPI *ref_mpi_ptr)

{
  REF_STATUS ref_private_macro_code_rss;
  REF_MPI *ref_mpi_ptr_local;
  
  ref_mpi_ptr_local._4_4_ = ref_mpi_create_from_comm(ref_mpi_ptr,(void *)0x0);
  if (ref_mpi_ptr_local._4_4_ == 0) {
    ref_mpi_ptr_local._4_4_ = 0;
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_mpi.c",0x83,
           "ref_mpi_create",(ulong)ref_mpi_ptr_local._4_4_,"create from NULL comm");
  }
  return ref_mpi_ptr_local._4_4_;
}

Assistant:

REF_FCN REF_STATUS ref_mpi_create(REF_MPI *ref_mpi_ptr) {
#ifdef HAVE_MPI
  MPI_Comm comm = MPI_COMM_WORLD;
  RSS(ref_mpi_create_from_comm(ref_mpi_ptr, (void *)(&(comm))),
      "create from MPI_WORLD_COMM");
#else
  RSS(ref_mpi_create_from_comm(ref_mpi_ptr, NULL), "create from NULL comm");
#endif

  return REF_SUCCESS;
}